

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 soft_f64_div(float64 a,float64 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  FloatParts FVar11;
  FloatParts FVar12;
  FloatParts p;
  FloatParts b_00;
  
  FVar11._8_8_ = a >> 0x34 & 0x7ff | a >> 0x17 & 0x10000000000;
  FVar11.frac = a & 0xfffffffffffff;
  FVar11 = sf_canonicalize(FVar11,&float64_params,status);
  uVar9 = FVar11._8_8_;
  uVar8 = FVar11.frac;
  FVar12.frac = b & 0xfffffffffffff;
  FVar12._8_8_ = b >> 0x34 & 0x7ff | b >> 0x17 & 0x10000000000;
  FVar12 = sf_canonicalize(FVar12,&float64_params,status);
  uVar5 = FVar12._8_8_;
  uVar10 = FVar12.frac;
  uVar6 = (uVar5 ^ uVar9) & 0x10000000000;
  uVar7 = FVar11._12_4_ & 0xff;
  uVar3 = FVar12._12_4_ & 0xff;
  if ((uVar7 == 2) && (uVar3 == 2)) {
    uVar5 = (ulong)((FVar11.exp - FVar12.exp) - (uint)(uVar8 < uVar10));
    lVar4 = 0;
    if (uVar10 <= uVar8) {
      lVar4 = uVar8 << 0x3f;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10 * 2;
    auVar2._8_8_ = uVar8 >> (uVar10 <= uVar8);
    auVar2._0_8_ = lVar4;
    uVar8 = (ulong)(SUB168(auVar2 % auVar1,0) != 0) | SUB168(auVar2 / auVar1,0);
    uVar9 = uVar9 & 0xffff00ff00000000;
  }
  else {
    if (((uVar9 | uVar5) & 0xfc00000000) != 0) {
      b_00._8_8_ = uVar5 & 0xffffffffffff;
      b_00.frac = uVar10;
      p = pick_nan(FVar11,b_00,status);
      goto LAB_00cf1b80;
    }
    if (((uVar9 >> 0x20 & 1) != 0) && (uVar7 == uVar3)) {
      status->float_exception_flags = status->float_exception_flags | 1;
      p.exp = 0x7fffffff;
      p.cls = float_class_qnan;
      p.sign = false;
      p._14_2_ = 0;
      p.frac = 0x2000000000000000;
      goto LAB_00cf1b80;
    }
    if ((uVar9 >> 0x20 & 1) != 0) {
      uVar6 = uVar6 | uVar9 & 0xffff0003ffffffff;
      p.exp = (int)uVar6;
      p.cls = (char)(uVar6 >> 0x20);
      p.sign = (_Bool)(char)(uVar6 >> 0x28);
      p._14_2_ = (short)(uVar6 >> 0x30);
      p.frac = uVar8;
      goto LAB_00cf1b80;
    }
    if (uVar3 == 3) {
      uVar10 = uVar9 & 0xffff0000ffffffff | uVar6 | 0x100000000;
      p.exp = (int)uVar10;
      p.cls = (char)(uVar10 >> 0x20);
      p.sign = (_Bool)(char)(uVar10 >> 0x28);
      p._14_2_ = (short)(uVar10 >> 0x30);
      p.frac = uVar8;
      goto LAB_00cf1b80;
    }
    if (uVar3 != 1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    status->float_exception_flags = status->float_exception_flags | 4;
    uVar9 = uVar9 & 0xffff0000ffffffff;
    uVar5 = 0x300000000;
  }
  uVar6 = uVar5 | uVar9 | uVar6;
  p.exp = (int)uVar6;
  p.cls = (char)(uVar6 >> 0x20);
  p.sign = (_Bool)(char)(uVar6 >> 0x28);
  p._14_2_ = (short)(uVar6 >> 0x30);
  p.frac = uVar8;
LAB_00cf1b80:
  FVar11 = round_canonical(p,status,&float64_params);
  return FVar11.frac & 0xfffffffffffff | (ulong)(FVar11.exp & 0x7ff) << 0x34 |
         (FVar11._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_f64_div(float64 a, float64 b, float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pb = float64_unpack_canonical(b, status);
    FloatParts pr = div_floats(pa, pb, status);

    return float64_round_pack_canonical(pr, status);
}